

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

void lyd_wd_leaflist_cleanup(ly_set *set,unres_data *unres)

{
  uint uVar1;
  lys_node *node;
  long lVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = set->number;
  bVar5 = uVar1 != 0;
  if (bVar5) {
    if (((ulong)(*(set->set).s)->dsc & 0x100) != 0) {
      lVar3 = 0;
      do {
        if (uVar1 - 1 == (int)lVar3) {
          return;
        }
        lVar2 = lVar3 + 1;
        lVar3 = lVar3 + 1;
      } while (((ulong)(set->set).s[lVar2]->dsc & 0x100) != 0);
      bVar5 = (uint)lVar3 < uVar1;
    }
    if ((bVar5) && (set->number != 0)) {
      uVar4 = 0;
      do {
        node = (set->set).s[uVar4];
        if (((ulong)node->dsc & 0x100) != 0) {
          if (unres->store_diff == 0) {
            lyd_free_internal_r((lyd_node *)node,1);
          }
          else {
            unres_data_diff_new(unres,(lyd_node *)node,(lyd_node *)node->iffeature,0);
            lyd_unlink_internal((lyd_node *)(set->set).s[uVar4],1);
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < set->number);
    }
  }
  return;
}

Assistant:

static void
lyd_wd_leaflist_cleanup(struct ly_set *set, struct unres_data *unres)
{
    unsigned int i;

    assert(set);

    /* if there is an instance without the dflt flag, we have to
     * remove all instances with the flag - an instance could be
     * explicitely added, so the default leaflists were invalidated */
    for (i = 0; i < set->number; i++) {
        if (!set->set.d[i]->dflt) {
            break;
        }
    }
    if (i < set->number) {
        for (i = 0; i < set->number; i++) {
            if (set->set.d[i]->dflt) {
                /* remove this default instance */
                if (unres->store_diff) {
                    /* just move it to diff if is being generated */
                    unres_data_diff_new(unres, set->set.d[i], set->set.d[i]->parent, 0);
                    lyd_unlink(set->set.d[i]);
                } else {
                    lyd_free(set->set.d[i]);
                }
            }
        }
    }
}